

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandlerGuard _;
  FatalConditionHandlerGuard local_10;
  
  local_10.m_handler = &this->m_fatalConditionhandler;
  FatalConditionHandler::engage(local_10.m_handler);
  (**((this->m_activeTestCase->test).
      super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_ITestInvoker)();
  FatalConditionHandlerGuard::~FatalConditionHandlerGuard(&local_10);
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandlerGuard _(&m_fatalConditionhandler);
        m_activeTestCase->invoke();
    }